

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_utf_validate(nk_rune *u,int i)

{
  uint uVar1;
  int in_EAX;
  nk_uint *pnVar2;
  
  if (u != (nk_rune *)0x0) {
    uVar1 = *u;
    if (((uVar1 < nk_utfmin[i]) || (uVar1 - 0xd800 < 0x7ff)) || (nk_utfmax[i] <= uVar1)) {
      *u = 0xfffd;
    }
    pnVar2 = nk_utfmax;
    do {
      pnVar2 = pnVar2 + 1;
    } while (*pnVar2 < *u);
    return in_EAX;
  }
  __assert_fail("u",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x1e67,"int nk_utf_validate(nk_rune *, int)");
}

Assistant:

NK_INTERN int
nk_utf_validate(nk_rune *u, int i)
{
    NK_ASSERT(u);
    if (!u) return 0;
    if (!NK_BETWEEN(*u, nk_utfmin[i], nk_utfmax[i]) ||
         NK_BETWEEN(*u, 0xD800, 0xDFFF))
            *u = NK_UTF_INVALID;
    for (i = 1; *u > nk_utfmax[i]; ++i);
    return i;
}